

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O1

bool __thiscall Entity::hit(Entity *this,int damage)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->hp;
  iVar2 = iVar1 - damage;
  this->hp = iVar2;
  this->hilightCount = 500;
  if (iVar2 == 0 || iVar1 < damage) {
    explode(this);
  }
  return iVar2 < 1;
}

Assistant:

bool Entity::hit(int damage)
{
   hp -= damage;

   hilightCount = 500;

   if (hp <= 0) {
      explode();
      return true;
   }

   return false;
}